

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebook.c
# Opt level: O0

static_codebook * vorbis_staticbook_unpack(oggpack_buffer *opb)

{
  long lVar1;
  int iVar2;
  int iVar3;
  static_codebook *b;
  long lVar4;
  long lVar5;
  char *pcVar6;
  long lVar7;
  long *plVar8;
  int local_90;
  int local_5c;
  int quantvals;
  long num_2;
  long length;
  long num_1;
  long num;
  long unused;
  static_codebook *s;
  long j;
  long i;
  oggpack_buffer *opb_local;
  
  b = (static_codebook *)calloc(1,0x48);
  b->allocedp = 1;
  lVar4 = oggpack_read(opb,0x18);
  if (lVar4 == 0x564342) {
    lVar4 = oggpack_read(opb,0x10);
    b->dim = lVar4;
    lVar4 = oggpack_read(opb,0x18);
    b->entries = lVar4;
    if (b->entries != -1) {
      iVar2 = ov_ilog((ogg_uint32_t)b->dim);
      iVar3 = ov_ilog((ogg_uint32_t)b->entries);
      if (iVar2 + iVar3 < 0x19) {
        lVar4 = oggpack_read(opb,1);
        if ((int)lVar4 == 0) {
          lVar7 = oggpack_read(opb,1);
          lVar4 = b->entries;
          iVar2 = 5;
          if (lVar7 != 0) {
            iVar2 = 1;
          }
          lVar1 = opb->storage;
          lVar5 = oggpack_bytes(opb);
          if (lVar1 - lVar5 < lVar4 * iVar2 + 7 >> 3) goto LAB_002c183c;
          pcVar6 = (char *)malloc(b->entries);
          b->lengthlist = pcVar6;
          if (lVar7 == 0) {
            for (j = 0; j < b->entries; j = j + 1) {
              lVar4 = oggpack_read(opb,5);
              if (lVar4 == -1) goto LAB_002c183c;
              b->lengthlist[j] = (char)lVar4 + '\x01';
            }
          }
          else {
            for (j = 0; j < b->entries; j = j + 1) {
              lVar4 = oggpack_read(opb,1);
              if (lVar4 == 0) {
                b->lengthlist[j] = '\0';
              }
              else {
                lVar4 = oggpack_read(opb,5);
                if (lVar4 == -1) goto LAB_002c183c;
                b->lengthlist[j] = (char)lVar4 + '\x01';
              }
            }
          }
        }
        else {
          if ((int)lVar4 != 1) goto LAB_002c183c;
          lVar4 = oggpack_read(opb,5);
          num_2 = lVar4 + 1;
          if (num_2 == 0) goto LAB_002c183c;
          pcVar6 = (char *)malloc(b->entries);
          b->lengthlist = pcVar6;
          j = 0;
          while (j < b->entries) {
            iVar2 = ov_ilog((int)b->entries - (int)j);
            lVar4 = oggpack_read(opb,iVar2);
            if ((((lVar4 == -1) || (0x20 < num_2)) || (b->entries - j < lVar4)) ||
               (((0 < lVar4 && (1 < lVar4 + -1 >> ((char)num_2 - 1U & 0x3f))) || (0x20 < num_2))))
            goto LAB_002c183c;
            for (s = (static_codebook *)0x0; (long)s < lVar4;
                s = (static_codebook *)((long)&s->dim + 1)) {
              b->lengthlist[j] = (char)num_2;
              j = j + 1;
            }
            num_2 = num_2 + 1;
          }
        }
        lVar4 = oggpack_read(opb,4);
        iVar2 = (int)lVar4;
        b->maptype = iVar2;
        if (iVar2 == 0) {
          return b;
        }
        if (iVar2 - 1U < 2) {
          lVar4 = oggpack_read(opb,0x20);
          b->q_min = lVar4;
          lVar4 = oggpack_read(opb,0x20);
          b->q_delta = lVar4;
          lVar4 = oggpack_read(opb,4);
          b->q_quant = (int)lVar4 + 1;
          lVar4 = oggpack_read(opb,1);
          b->q_sequencep = (int)lVar4;
          if (b->q_sequencep != -1) {
            local_5c = 0;
            if (b->maptype == 1) {
              if (b->dim == 0) {
                local_90 = 0;
              }
              else {
                lVar4 = _book_maptype1_quantvals(b);
                local_90 = (int)lVar4;
              }
              local_5c = local_90;
            }
            else if (b->maptype == 2) {
              local_5c = (int)b->entries * (int)b->dim;
            }
            iVar2 = b->q_quant;
            lVar4 = opb->storage;
            lVar7 = oggpack_bytes(opb);
            if ((long)(local_5c * iVar2 + 7 >> 3) <= lVar4 - lVar7) {
              plVar8 = (long *)malloc((long)local_5c << 3);
              b->quantlist = plVar8;
              for (j = 0; j < local_5c; j = j + 1) {
                lVar4 = oggpack_read(opb,b->q_quant);
                b->quantlist[j] = lVar4;
              }
              if (local_5c == 0) {
                return b;
              }
              if (b->quantlist[local_5c + -1] != -1) {
                return b;
              }
            }
          }
        }
      }
    }
  }
LAB_002c183c:
  vorbis_staticbook_destroy(b);
  return (static_codebook *)0x0;
}

Assistant:

static_codebook *vorbis_staticbook_unpack(oggpack_buffer *opb){
  long i,j;
  static_codebook *s=_ogg_calloc(1,sizeof(*s));
  s->allocedp=1;

  /* make sure alignment is correct */
  if(oggpack_read(opb,24)!=0x564342)goto _eofout;

  /* first the basic parameters */
  s->dim=oggpack_read(opb,16);
  s->entries=oggpack_read(opb,24);
  if(s->entries==-1)goto _eofout;

  if(ov_ilog(s->dim)+ov_ilog(s->entries)>24)goto _eofout;

  /* codeword ordering.... length ordered or unordered? */
  switch((int)oggpack_read(opb,1)){
  case 0:{
    long unused;
    /* allocated but unused entries? */
    unused=oggpack_read(opb,1);
    if((s->entries*(unused?1:5)+7)>>3>opb->storage-oggpack_bytes(opb))
      goto _eofout;
    /* unordered */
    s->lengthlist=_ogg_malloc(sizeof(*s->lengthlist)*s->entries);

    /* allocated but unused entries? */
    if(unused){
      /* yes, unused entries */

      for(i=0;i<s->entries;i++){
        if(oggpack_read(opb,1)){
          long num=oggpack_read(opb,5);
          if(num==-1)goto _eofout;
          s->lengthlist[i]=num+1;
        }else
          s->lengthlist[i]=0;
      }
    }else{
      /* all entries used; no tagging */
      for(i=0;i<s->entries;i++){
        long num=oggpack_read(opb,5);
        if(num==-1)goto _eofout;
        s->lengthlist[i]=num+1;
      }
    }

    break;
  }
  case 1:
    /* ordered */
    {
      long length=oggpack_read(opb,5)+1;
      if(length==0)goto _eofout;
      s->lengthlist=_ogg_malloc(sizeof(*s->lengthlist)*s->entries);

      for(i=0;i<s->entries;){
        long num=oggpack_read(opb,ov_ilog(s->entries-i));
        if(num==-1)goto _eofout;
        if(length>32 || num>s->entries-i ||
           (num>0 && (num-1)>>(length-1)>1)){
          goto _errout;
        }
        if(length>32)goto _errout;
        for(j=0;j<num;j++,i++)
          s->lengthlist[i]=length;
        length++;
      }
    }
    break;
  default:
    /* EOF */
    goto _eofout;
  }

  /* Do we have a mapping to unpack? */
  switch((s->maptype=oggpack_read(opb,4))){
  case 0:
    /* no mapping */
    break;
  case 1: case 2:
    /* implicitly populated value mapping */
    /* explicitly populated value mapping */

    s->q_min=oggpack_read(opb,32);
    s->q_delta=oggpack_read(opb,32);
    s->q_quant=oggpack_read(opb,4)+1;
    s->q_sequencep=oggpack_read(opb,1);
    if(s->q_sequencep==-1)goto _eofout;

    {
      int quantvals=0;
      switch(s->maptype){
      case 1:
        quantvals=(s->dim==0?0:_book_maptype1_quantvals(s));
        break;
      case 2:
        quantvals=s->entries*s->dim;
        break;
      }

      /* quantized values */
      if(((quantvals*s->q_quant+7)>>3)>opb->storage-oggpack_bytes(opb))
        goto _eofout;
      s->quantlist=_ogg_malloc(sizeof(*s->quantlist)*quantvals);
      for(i=0;i<quantvals;i++)
        s->quantlist[i]=oggpack_read(opb,s->q_quant);

      if(quantvals&&s->quantlist[quantvals-1]==-1)goto _eofout;
    }
    break;
  default:
    goto _errout;
  }

  /* all set */
  return(s);

 _errout:
 _eofout:
  vorbis_staticbook_destroy(s);
  return(NULL);
}